

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_4,_0,_13>::evaluate
               (ShaderEvalContext *evalCtx)

{
  undefined8 *puVar1;
  int col;
  undefined4 *puVar2;
  int row;
  long lVar3;
  long lVar4;
  float v;
  float fVar5;
  float local_98 [6];
  Vector<float,_4> res;
  int local_70 [6];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_58 = *(undefined8 *)(evalCtx->coords).m_data;
  uStack_50 = *(undefined8 *)((evalCtx->coords).m_data + 2);
  puVar1 = &local_48;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  puVar2 = &DAT_02286980;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)puVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar2 = puVar2 + 1;
  } while (lVar3 != 4);
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  puVar1 = &local_48;
  lVar3 = 0;
  do {
    fVar5 = 0.0;
    lVar4 = 0;
    do {
      fVar5 = fVar5 + *(float *)((long)puVar1 + lVar4 * 4) * *(float *)((long)&local_58 + lVar4 * 4)
      ;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    local_98[lVar3] = fVar5;
    lVar3 = lVar3 + 1;
    puVar1 = puVar1 + 2;
  } while (lVar3 != 4);
  res.m_data[1] = local_98[0];
  res.m_data[2] = local_98[1];
  res.m_data[3] = local_98[2] + local_98[3];
  local_70[2] = 0;
  local_70[3] = 1;
  local_70[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_70[lVar3]] = res.m_data[lVar3 + -1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}